

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O2

CURLcode imap_setup_connection(connectdata *conn)

{
  char **ppcVar1;
  Curl_easy *pCVar2;
  CURLcode CVar3;
  void *pvVar4;
  Curl_handler *pCVar5;
  Curl_easy *data;
  
  pCVar2 = conn->data;
  pvVar4 = (*Curl_ccalloc)(0x48,1);
  (pCVar2->req).protop = pvVar4;
  if (pvVar4 == (void *)0x0) {
    CVar3 = CURLE_OUT_OF_MEMORY;
  }
  else {
    conn->tls_upgraded = false;
    if (((conn->bits).httpproxy == true) && ((pCVar2->set).tunnel_thru_httpproxy == false)) {
      pCVar5 = &Curl_handler_imaps_proxy;
      if (conn->handler == &Curl_handler_imap) {
        pCVar5 = &Curl_handler_imap_proxy;
      }
      conn->handler = pCVar5;
      CVar3 = Curl_http_setup_conn(conn);
      return CVar3;
    }
    ppcVar1 = &(pCVar2->state).path;
    *ppcVar1 = *ppcVar1 + 1;
    CVar3 = CURLE_OK;
  }
  return CVar3;
}

Assistant:

static CURLcode imap_setup_connection(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;

  /* Initialise the IMAP layer */
  CURLcode result = imap_init(conn);
  if(result)
    return result;

  /* Clear the TLS upgraded flag */
  conn->tls_upgraded = FALSE;

  /* Set up the proxy if necessary */
  if(conn->bits.httpproxy && !data->set.tunnel_thru_httpproxy) {
    /* Unless we have asked to tunnel IMAP operations through the proxy, we
       switch and use HTTP operations only */
#ifndef CURL_DISABLE_HTTP
    if(conn->handler == &Curl_handler_imap)
      conn->handler = &Curl_handler_imap_proxy;
    else {
#ifdef USE_SSL
      conn->handler = &Curl_handler_imaps_proxy;
#else
      failf(data, "IMAPS not supported!");
      return CURLE_UNSUPPORTED_PROTOCOL;
#endif
    }

    /* set it up as an HTTP connection instead */
    return conn->handler->setup_connection(conn);
#else
    failf(data, "IMAP over http proxy requires HTTP support built-in!");
    return CURLE_UNSUPPORTED_PROTOCOL;
#endif
  }

  data->state.path++;   /* don't include the initial slash */

  return CURLE_OK;
}